

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

void anm_extract(anm_archive_t *anm,char *name)

{
  long *plVar1;
  uint uVar2;
  uchar *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  list_node_t *plVar6;
  uint uVar7;
  int iVar8;
  ulong __size;
  image_t image;
  image_t local_48;
  
  local_48.width = 0;
  local_48.height = 0;
  local_48.format = 0xffffffff;
  util_total_entry_size(anm,name,&local_48.width,&local_48.height);
  if (local_48.height != 0 && local_48.width != 0) {
    __size = (ulong)(local_48.width * local_48.height * 4);
    local_48.data = (uchar *)malloc(__size);
    memset(local_48.data,0xff,__size);
    lVar4 = 0;
    plVar6 = (list_node_t *)&anm->entries;
    do {
      while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
        plVar1 = (long *)plVar6->data;
        if ((*(short *)(*plVar1 + 0x34) != 0) && ((char *)plVar1[2] == name)) {
          lVar5 = plVar1[1];
          if ((&DAT_0012ed10)[lVar4] == (uint)*(ushort *)(lVar5 + 6)) {
            __ptr = format_to_rgba((uchar *)plVar1[8],
                                   (uint)*(ushort *)(lVar5 + 10) * (uint)*(ushort *)(lVar5 + 8),
                                   (uint)*(ushort *)(lVar5 + 6));
            lVar5 = *plVar1;
            lVar3 = plVar1[1];
            uVar2 = *(uint *)(lVar5 + 0x24);
            if (uVar2 < *(ushort *)(lVar3 + 10) + uVar2) {
              iVar8 = uVar2 * 4;
              uVar7 = uVar2;
              do {
                memcpy(local_48.data +
                       (ulong)(uint)(*(int *)(lVar5 + 0x20) << 2) + (ulong)(local_48.width * iVar8),
                       __ptr + (iVar8 + uVar2 * -4) * (uint)*(ushort *)(lVar3 + 8),
                       (ulong)*(ushort *)(lVar3 + 8) << 2);
                uVar7 = uVar7 + 1;
                lVar5 = *plVar1;
                lVar3 = plVar1[1];
                uVar2 = *(uint *)(lVar5 + 0x24);
                iVar8 = iVar8 + 4;
              } while (uVar7 < *(ushort *)(lVar3 + 10) + uVar2);
            }
            free(__ptr);
          }
        }
      }
      lVar4 = lVar4 + 1;
      plVar6 = (list_node_t *)&anm->entries;
    } while (lVar4 != 5);
    util_makepath(name);
    png_write(name,&local_48);
    free(local_48.data);
  }
  return;
}

Assistant:

static void
anm_extract(
    const anm_archive_t* anm,
    const char* name)
{
    const format_t formats[] = {
        FORMAT_GRAY8,
        FORMAT_ARGB4444,
        FORMAT_RGB565,
        FORMAT_BGRA8888,
        FORMAT_RGBA8888
    };
    image_t image;

    unsigned int f, y;

    image.width = 0;
    image.height = 0;
    image.format = FORMAT_RGBA8888;

    util_total_entry_size(anm, name, &image.width, &image.height);

    if (image.width == 0 || image.height == 0) {
        /* Then there's nothing to extract. */
        return;
    }

    image.data = malloc(image.width * image.height * 4);
    /* XXX: Why 0xff? */
    memset(image.data, 0xff, image.width * image.height * 4);

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        anm_entry_t* entry;
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && entry->name == name && formats[f] == entry->thtx->format) {
                unsigned char* temp_data = format_to_rgba(entry->data, entry->thtx->w * entry->thtx->h, entry->thtx->format);
                for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                    memcpy(image.data + y * image.width * 4 + entry->header->x * 4,
                           temp_data + (y - entry->header->y) * entry->thtx->w * 4,
                           entry->thtx->w * 4);
                }
                free(temp_data);
            }
        }
    }

    util_makepath(name);
    png_write(name, &image);

    free(image.data);
}